

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
 __thiscall
Lib::
Stack<std::unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>_>
::pop(Stack<std::unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>_>
      *this)

{
  unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  *in_RSI;
  __uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
  in_RDI;
  unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  *res;
  unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  
  in_RSI[2]._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
  ._M_head_impl =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
       &in_RSI[2]._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
        ._M_head_impl[-1]._end;
  std::
  unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ::unique_ptr((unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                *)in_RDI.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                  ._M_head_impl,in_stack_ffffffffffffffc8);
  std::
  unique_ptr<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ::~unique_ptr(in_RSI);
  return (__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
          )(tuple<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
             ._M_head_impl;
}

Assistant:

inline
  C pop()
  {
    ASS(_cursor > _stack);
    _cursor--;

    C res = std::move(*_cursor);
    _cursor->~C();

    return res;
  }